

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O0

nfa_state_t ** re2c::closure(nfa_state_t **cP,nfa_state_t *n)

{
  nfa_state_t **cP_00;
  nfa_state_t *n_local;
  nfa_state_t **cP_local;
  
  n_local = (nfa_state_t *)cP;
  if ((n->mark & 1U) == 0) {
    n->mark = true;
    if (n->type == ALT) {
      cP_00 = closure(cP,(n->value).alt.out2);
      n_local = (nfa_state_t *)closure(cP_00,(n->value).alt.out1);
      n->mark = false;
    }
    else if (n->type == CTX) {
      *cP = n;
      n_local = (nfa_state_t *)closure(cP + 1,(n->value).alt.out1);
    }
    else {
      n_local = (nfa_state_t *)(cP + 1);
      *cP = n;
    }
  }
  return (nfa_state_t **)n_local;
}

Assistant:

static nfa_state_t **closure(nfa_state_t **cP, nfa_state_t *n)
{
	if (!n->mark)
	{
		n->mark = true;
		switch (n->type)
		{
			case nfa_state_t::ALT:
				cP = closure(cP, n->value.alt.out2);
				cP = closure(cP, n->value.alt.out1);
				n->mark = false;
				break;
			case nfa_state_t::CTX:
				*(cP++) = n;
				cP = closure(cP, n->value.ctx.out);
				break;
			default:
				*(cP++) = n;
				break;
		}
	}

	return cP;
}